

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O0

void __thiscall
cmDebugServerConsole::OnWatchpoint
          (cmDebugServerConsole *this,string *variable,int access,string *newValue)

{
  ostream *poVar1;
  char *pcVar2;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0;
  string *local_28;
  string *newValue_local;
  string *psStack_18;
  int access_local;
  string *variable_local;
  cmDebugServerConsole *this_local;
  
  local_28 = newValue;
  newValue_local._4_4_ = access;
  psStack_18 = variable;
  variable_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(&local_1a0,"Watchpoint \'");
  poVar1 = std::operator<<(poVar1,(string *)psStack_18);
  poVar1 = std::operator<<(poVar1,"\' hit -- \'");
  poVar1 = std::operator<<(poVar1,(string *)local_28);
  poVar1 = std::operator<<(poVar1,"\' (");
  pcVar2 = cmVariableWatch::GetAccessAsString(newValue_local._4_4_);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,")");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar1,(string *)&PROMPT_abi_cxx11_);
  std::__cxx11::stringstream::str();
  cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void cmDebugServerConsole::OnWatchpoint(const std::string& variable,
                                        int access,
                                        const std::string& newValue)
{
  std::stringstream ss;
  ss << "Watchpoint '" << variable << "' hit -- '" << newValue << "' ("
     << cmVariableWatch::GetAccessAsString(access) << ")" << std::endl
     << PROMPT;

  AsyncBroadcast(ss.str());
}